

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeNextOpcode(Vdbe *p,Mem *pSub,int eMode,int *piPc,int *piAddr,Op **paOp)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int local_68;
  int j_1;
  int nByte;
  int j;
  int iPc;
  Op *aOp;
  int rc;
  int i;
  SubProgram **apSub;
  int nSub;
  int nRow;
  Op **paOp_local;
  int *piAddr_local;
  int *piPc_local;
  int eMode_local;
  Mem *pSub_local;
  Vdbe *p_local;
  
  apSub._0_4_ = 0;
  _rc = (char *)0x0;
  aOp._0_4_ = 0;
  _j = (Op *)0x0;
  apSub._4_4_ = p->nOp;
  if (pSub != (Mem *)0x0) {
    if ((pSub->flags & 0x10) != 0) {
      apSub._0_4_ = (int)((ulong)(long)pSub->n >> 3);
      _rc = pSub->z;
    }
    for (aOp._4_4_ = 0; aOp._4_4_ < (int)apSub; aOp._4_4_ = aOp._4_4_ + 1) {
      apSub._4_4_ = *(int *)(*(long *)(_rc + (long)aOp._4_4_ * 8) + 8) + apSub._4_4_;
    }
  }
  nByte = *piPc;
  do {
    iVar2 = nByte + 1;
    aOp._4_4_ = nByte;
    if (apSub._4_4_ <= nByte) {
      p->rc = 0;
      aOp._0_4_ = 0x65;
      goto LAB_0015d873;
    }
    if (nByte < p->nOp) {
      _j = p->aOp;
    }
    else {
      j_1 = 0;
      for (aOp._4_4_ = nByte - p->nOp; *(int *)(*(long *)(_rc + (long)j_1 * 8) + 8) <= aOp._4_4_;
          aOp._4_4_ = aOp._4_4_ - *(int *)(*(long *)(_rc + lVar3 * 8) + 8)) {
        lVar3 = (long)j_1;
        j_1 = j_1 + 1;
      }
      _j = (Op *)**(undefined8 **)(_rc + (long)j_1 * 8);
    }
    if ((pSub != (Mem *)0x0) && (_j[aOp._4_4_].p4type == -4)) {
      local_68 = 0;
      while ((local_68 < (int)apSub && (*(void **)(_rc + (long)local_68 * 8) != _j[aOp._4_4_].p4.p))
            ) {
        local_68 = local_68 + 1;
      }
      if (local_68 == (int)apSub) {
        iVar1 = sqlite3VdbeMemGrow(pSub,((int)apSub + 1) * 8,(uint)((int)apSub != 0));
        p->rc = iVar1;
        if (p->rc != 0) {
          aOp._0_4_ = 1;
LAB_0015d873:
          *piPc = iVar2;
          *piAddr = aOp._4_4_;
          *paOp = _j;
          return (int)aOp;
        }
        _rc = pSub->z;
        *(p4union *)(_rc + (long)(int)apSub * 8) = _j[aOp._4_4_].p4;
        pSub->flags = pSub->flags & 0xf240 | 0x10;
        pSub->n = ((int)apSub + 1) * 8;
        apSub._4_4_ = (_j[aOp._4_4_].p4.pProgram)->nOp + apSub._4_4_;
        apSub._0_4_ = (int)apSub + 1;
      }
    }
    if (((eMode == 0) || (_j[aOp._4_4_].opcode == 0xbc)) ||
       ((nByte = iVar2, _j[aOp._4_4_].opcode == '\b' && (1 < iVar2)))) goto LAB_0015d873;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeNextOpcode(
  Vdbe *p,         /* The statement being explained */
  Mem *pSub,       /* Storage for keeping track of subprogram nesting */
  int eMode,       /* 0: normal.  1: EQP.  2:  TablesUsed */
  int *piPc,       /* IN/OUT: Current rowid.  Overwritten with next rowid */
  int *piAddr,     /* OUT: Write index into (*paOp)[] here */
  Op **paOp        /* OUT: Write the opcode array here */
){
  int nRow;                            /* Stop when row count reaches this */
  int nSub = 0;                        /* Number of sub-vdbes seen so far */
  SubProgram **apSub = 0;              /* Array of sub-vdbes */
  int i;                               /* Next instruction address */
  int rc = SQLITE_OK;                  /* Result code */
  Op *aOp = 0;                         /* Opcode array */
  int iPc;                             /* Rowid.  Copy of value in *piPc */

  /* When the number of output rows reaches nRow, that means the
  ** listing has finished and sqlite3_step() should return SQLITE_DONE.
  ** nRow is the sum of the number of rows in the main program, plus
  ** the sum of the number of rows in all trigger subprograms encountered
  ** so far.  The nRow value will increase as new trigger subprograms are
  ** encountered, but p->pc will eventually catch up to nRow.
  */
  nRow = p->nOp;
  if( pSub!=0 ){
    if( pSub->flags&MEM_Blob ){
      /* pSub is initiallly NULL.  It is initialized to a BLOB by
      ** the P4_SUBPROGRAM processing logic below */
      nSub = pSub->n/sizeof(Vdbe*);
      apSub = (SubProgram **)pSub->z;
    }
    for(i=0; i<nSub; i++){
      nRow += apSub[i]->nOp;
    }
  }
  iPc = *piPc;
  while(1){  /* Loop exits via break */
    i = iPc++;
    if( i>=nRow ){
      p->rc = SQLITE_OK;
      rc = SQLITE_DONE;
      break;
    }
    if( i<p->nOp ){
      /* The rowid is small enough that we are still in the
      ** main program. */
      aOp = p->aOp;
    }else{
      /* We are currently listing subprograms.  Figure out which one and
      ** pick up the appropriate opcode. */
      int j;
      i -= p->nOp;
      assert( apSub!=0 );
      assert( nSub>0 );
      for(j=0; i>=apSub[j]->nOp; j++){
        i -= apSub[j]->nOp;
        assert( i<apSub[j]->nOp || j+1<nSub );
      }
      aOp = apSub[j]->aOp;
    }

    /* When an OP_Program opcode is encounter (the only opcode that has
    ** a P4_SUBPROGRAM argument), expand the size of the array of subprograms
    ** kept in p->aMem[9].z to hold the new program - assuming this subprogram
    ** has not already been seen.
    */
    if( pSub!=0 && aOp[i].p4type==P4_SUBPROGRAM ){
      int nByte = (nSub+1)*sizeof(SubProgram*);
      int j;
      for(j=0; j<nSub; j++){
        if( apSub[j]==aOp[i].p4.pProgram ) break;
      }
      if( j==nSub ){
        p->rc = sqlite3VdbeMemGrow(pSub, nByte, nSub!=0);
        if( p->rc!=SQLITE_OK ){
          rc = SQLITE_ERROR;
          break;
        }
        apSub = (SubProgram **)pSub->z;
        apSub[nSub++] = aOp[i].p4.pProgram;
        MemSetTypeFlag(pSub, MEM_Blob);
        pSub->n = nSub*sizeof(SubProgram*);
        nRow += aOp[i].p4.pProgram->nOp;
      }
    }
    if( eMode==0 ) break;
#ifdef SQLITE_ENABLE_BYTECODE_VTAB
    if( eMode==2 ){
      Op *pOp = aOp + i;
      if( pOp->opcode==OP_OpenRead ) break;
      if( pOp->opcode==OP_OpenWrite && (pOp->p5 & OPFLAG_P2ISREG)==0 ) break;
      if( pOp->opcode==OP_ReopenIdx ) break;
    }else
#endif
    {
      assert( eMode==1 );
      if( aOp[i].opcode==OP_Explain ) break;
      if( aOp[i].opcode==OP_Init && iPc>1 ) break;
    }
  }
  *piPc = iPc;
  *piAddr = i;
  *paOp = aOp;
  return rc;
}